

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# received_packet.h
# Opt level: O2

void __thiscall
ReceivedPacket::ReceivedPacket
          (ReceivedPacket *this,uint16_t sequence_number,uint8_t *data,uint16_t data_len)

{
  pointer __p;
  undefined2 in_register_0000000a;
  
  this->sequence_number = 0;
  (this->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  this->data_len = data_len;
  __p = (pointer)operator_new__((ulong)CONCAT22(in_register_0000000a,data_len));
  std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>::reset
            ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_> *)&this->data,__p)
  ;
  memcpy((this->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>
         ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,data,
         (ulong)CONCAT22(in_register_0000000a,data_len));
  this->sequence_number = sequence_number;
  return;
}

Assistant:

explicit ReceivedPacket(uint16_t sequence_number, const uint8_t* data, uint16_t data_len) {
		this->data_len = data_len;
		this->data.reset(new uint8_t[data_len]);
		memcpy(this->data.get(), data, data_len);
		this->sequence_number = sequence_number;
	}